

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::Matrix::makeRotation(Matrix *dst,V3d *axis,float32 angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  V3d VVar4;
  float32 t;
  float32 c;
  float32 s;
  float local_38;
  float local_2c;
  float fStack_28;
  V3d v;
  float32 len;
  float32 angle_local;
  V3d *axis_local;
  Matrix *dst_local;
  
  v.y = dot(axis,axis);
  if (((float)v.y != 0.0) || (NAN((float)v.y))) {
    fVar1 = sqrtf((float)v.y);
    v.y = (float32)(1.0 / fVar1);
  }
  VVar4 = rw::scale(axis,v.y);
  local_38 = (float)VVar4.z;
  fVar1 = ((float)angle * 3.1415927) / 180.0;
  fVar2 = sinf(fVar1);
  fVar1 = cosf(fVar1);
  fVar3 = 1.0 - fVar1;
  local_2c = (float)VVar4.x;
  (dst->right).x = (float32)(local_2c * local_2c * fVar3 + fVar1);
  fStack_28 = (float)VVar4.y;
  (dst->right).y = (float32)(local_2c * fStack_28 * fVar3 + local_38 * fVar2);
  (dst->right).z = (float32)(local_38 * local_2c * fVar3 + -(fStack_28 * fVar2));
  (dst->up).x = (float32)(local_2c * fStack_28 * fVar3 + -(local_38 * fVar2));
  (dst->up).y = (float32)(fStack_28 * fStack_28 * fVar3 + fVar1);
  (dst->up).z = (float32)(fStack_28 * local_38 * fVar3 + local_2c * fVar2);
  (dst->at).x = (float32)(local_38 * local_2c * fVar3 + fStack_28 * fVar2);
  (dst->at).y = (float32)(fStack_28 * local_38 * fVar3 + -(local_2c * fVar2));
  (dst->at).z = (float32)(local_38 * local_38 * fVar3 + fVar1);
  (dst->pos).x = 0.0;
  (dst->pos).y = 0.0;
  (dst->pos).z = 0.0;
  dst->flags = 3;
  dst->pad3 = 0;
  dst->pad2 = 0;
  dst->pad1 = 0;
  return;
}

Assistant:

void
Matrix::makeRotation(Matrix *dst, const V3d *axis, float32 angle)
{
//	V3d v = normalize(*axis);
	float32 len = dot(*axis, *axis);
	if(len != 0.0f) len = 1.0f/sqrtf(len);
	V3d v = rw::scale(*axis, len);
	angle = angle*(float)M_PI/180.0f;
	float32 s = sinf(angle);
	float32 c = cosf(angle);
	float32 t = 1.0f - c;

	dst->right.x = c + v.x*v.x*t;
	dst->right.y = v.x*v.y*t + v.z*s;
	dst->right.z = v.z*v.x*t - v.y*s;
	dst->up.x = v.x*v.y*t - v.z*s;
	dst->up.y = c + v.y*v.y*t;
	dst->up.z = v.y*v.z*t + v.x*s;
	dst->at.x = v.z*v.x*t + v.y*s;
	dst->at.y = v.y*v.z*t - v.x*s;
	dst->at.z = c + v.z*v.z*t;
	dst->pos.x = 0.0;
	dst->pos.y = 0.0;
	dst->pos.z = 0.0;
	dst->flags = TYPEORTHONORMAL;
	dst->pad1 = dst->pad2 = dst->pad3 = 0;
}